

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  long start;
  Scalar SVar3;
  long lVar4;
  long end;
  Index index;
  long lVar5;
  
  end = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols *
        (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows;
  lVar4 = end / 2;
  start = lVar4 * 2;
  for (lVar5 = 0; SBORROW8(lVar5,start) != lVar5 + lVar4 * -2 < 0; lVar5 = lVar5 + 2) {
    pSVar1 = (kernel->m_src->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>).
             m_data + lVar5;
    SVar3 = pSVar1[1];
    pSVar2 = (kernel->m_dst->
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>).
             m_data + lVar5;
    *pSVar2 = *pSVar1;
    pSVar2[1] = SVar3;
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,start,end);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC Index innerSize() const   { return m_dstExpr.innerSize(); }